

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::EntryPointInfo::ProcessJitTransferData(EntryPointInfo *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JitTransferData *pJVar4;
  ScriptContext *scriptContext;
  AutoCleanup local_28;
  AutoCleanup autoCleanup;
  
  bVar2 = IsCleanedUp(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x2089,"(!IsCleanedUp())","!IsCleanedUp()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pJVar4 = GetJitTransferData(this);
  if (pJVar4 != (JitTransferData *)0x0) {
    local_28.entryPointInfo = this;
    scriptContext = GetScriptContext(this);
    if (pJVar4->isReady == true) {
      PinTypeRefs(this,scriptContext);
      InstallGuards(this,scriptContext);
    }
    FreeJitTransferData(this);
    local_28.entryPointInfo = (EntryPointInfo *)0x0;
    ProcessJitTransferData::AutoCleanup::~AutoCleanup(&local_28);
  }
  return;
}

Assistant:

void EntryPointInfo::ProcessJitTransferData()
    {
        Assert(!IsCleanedUp());

        auto jitTransferData = GetJitTransferData();
        if (jitTransferData == nullptr)
        {
            return;
        }

        class AutoCleanup
        {
            EntryPointInfo *entryPointInfo;
        public:
            AutoCleanup(EntryPointInfo *entryPointInfo) : entryPointInfo(entryPointInfo)
            {
            }

            void Done()
            {
                entryPointInfo = nullptr;
            }
            ~AutoCleanup()
            {
                if (entryPointInfo)
                {
                    entryPointInfo->OnNativeCodeInstallFailure();
                }
            }
        } autoCleanup(this);


        ScriptContext* scriptContext = GetScriptContext();

        if (jitTransferData->GetIsReady())
        {
            PinTypeRefs(scriptContext);
            InstallGuards(scriptContext);
        }

        FreeJitTransferData();

        autoCleanup.Done();
    }